

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysex.c
# Opt level: O1

void receive_multiple_test(void)

{
  PtError PVar1;
  int inputDevice;
  char *__format;
  
  puts("This test expects to receive data sent by the send_multiple test");
  puts("The test will check that correct data is received.");
  receive_poll_running = 0;
  PVar1 = Pt_Start(1,receive_poll,(void *)0x0);
  if (PVar1 == ptNoError) {
    inputDevice = get_number("Type input device number: ");
    Pm_OpenInput(&receive_msg_midi_in,inputDevice,(void *)0x0,0x200,(PmTimeProcPtr)0x0,(void *)0x0);
    receive_msg_index = 0;
    receive_msg_length = 0;
    receive_msg_count = -1;
    receive_msg_error = '\0';
    receive_poll_running = 1;
    do {
      sleep(1);
      if (receive_msg_error != '\0') break;
    } while (receive_msg_count != 0);
    if (receive_msg_error != '\0') {
      puts("Receive_multiple test encountered an error");
      goto LAB_00103dd8;
    }
    __format = "Receive_multiple test successfully received %d sysex messages\n";
    PVar1 = receive_msg_messages;
  }
  else {
    __format = "PortTime error code: %d\n";
  }
  printf(__format,(ulong)(uint)PVar1);
LAB_00103dd8:
  receive_poll_running = 0;
  Pm_Close(receive_msg_midi_in);
  Pt_Stop();
  return;
}

Assistant:

void receive_multiple_test()
{
    PmError err;
    int inp;
    
    printf("This test expects to receive data sent by the send_multiple test\n");
    printf("The test will check that correct data is received.\n");

    /* Important: start PortTime first -- if it is not started first, it will
       be started by PortMidi, and then our attempt to open again will fail */
    receive_poll_running = false;
    if ((err = Pt_Start(1, receive_poll, 0))) {
        printf("PortTime error code: %d\n", err);
        goto cleanup;
    }
    inp = get_number("Type input device number: ");
    Pm_OpenInput(&receive_msg_midi_in, inp, NULL, 512, NULL, NULL);
    receive_msg_index = 0;
    receive_msg_length = 0;
    receive_msg_count = -1;
    receive_msg_error = 0;
    receive_poll_running = true;
    while ((!receive_msg_error) && (receive_msg_count != 0)) {
#ifdef WIN32
        Sleep(1000);
#else
        sleep(1); /* block and wait */
#endif
    }
    if (receive_msg_error) {
        printf("Receive_multiple test encountered an error\n");
    } else {
        printf("Receive_multiple test successfully received %d sysex messages\n", 
               receive_msg_messages);
    }
cleanup:
    receive_poll_running = false;
    Pm_Close(receive_msg_midi_in);
    Pt_Stop();
    return;
}